

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

void dg::DOD::constructTernaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  bool bVar1;
  CDNode *this;
  _Rb_tree_const_iterator<dg::CDNode_*> this_00;
  pair<std::_Rb_tree_const_iterator<dg::CDNode_*>,_bool> pVar2;
  CDNode *gncur;
  CDNode *ncur;
  CDNode *gcur;
  CDNode *cur;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  
  do {
    ColoredAp::getGNode((ColoredAp *)in_stack_ffffffffffffff90._M_node,
                        (CDNode *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
    do {
      this = ColoredAp::getGNode((ColoredAp *)in_stack_ffffffffffffff90._M_node,
                                 (CDNode *)
                                 CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                    *)this,(key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8)
                  );
      pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                        ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)in_stack_ffffffffffffff90._M_node,
                         (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88)
                        );
      in_stack_ffffffffffffffa8 = pVar2.second;
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                    *)this,(key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8)
                  );
      pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                        ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)in_stack_ffffffffffffff90._M_node,
                         (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88)
                        );
      in_stack_ffffffffffffff90 = pVar2.first._M_node;
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                    *)this,(key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8)
                  );
      pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                        ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)in_stack_ffffffffffffff90._M_node,
                         (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88)
                        );
      in_stack_ffffffffffffff88 = pVar2.second;
      std::
      map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
      ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                    *)this,(key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8)
                  );
      pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                        ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
                          *)in_stack_ffffffffffffff90._M_node,
                         (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88)
                        );
      this_00 = pVar2.first._M_node;
      ElemWithEdges<dg::CDNode>::getSingleSuccessor((ElemWithEdges<dg::CDNode> *)this_00._M_node);
      bVar1 = ColoredAp::isBlue((ColoredAp *)this_00._M_node,
                                (CDNode *)
                                CONCAT17(in_stack_ffffffffffffff6f,
                                         CONCAT16(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff68)));
      in_stack_ffffffffffffff6f = true;
      if (!bVar1) {
        in_stack_ffffffffffffff6f =
             ColoredAp::isRed((ColoredAp *)this_00._M_node,
                              (CDNode *)
                              CONCAT17(1,CONCAT16(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff68)));
      }
    } while (((in_stack_ffffffffffffff6f ^ 0xff) & 1) != 0);
    ElemWithEdges<dg::CDNode>::getSingleSuccessor((ElemWithEdges<dg::CDNode> *)this_00._M_node);
    bVar1 = ColoredAp::isBlue((ColoredAp *)this_00._M_node,
                              (CDNode *)
                              CONCAT17(in_stack_ffffffffffffff6f,
                                       CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)
                                      ));
    in_stack_ffffffffffffff6e = true;
    if (!bVar1) {
      in_stack_ffffffffffffff6e =
           ColoredAp::isRed((ColoredAp *)this_00._M_node,
                            (CDNode *)
                            CONCAT17(in_stack_ffffffffffffff6f,CONCAT16(1,in_stack_ffffffffffffff68)
                                    ));
    }
  } while (((in_stack_ffffffffffffff6e ^ 0xff) & 1) != 0);
  return;
}

Assistant:

static void constructTernaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                         ResultT &revCD, CDNode *b2, CDNode *b3,
                                         CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);

            auto *ncur = r2;
            do {
                auto *gncur = CAp.getGNode(ncur);
                assert(gncur);
                // DBG(cda, p->getID() << " - dod -> {" << gcur->getID() << ", "
                //                                     << gncur->getID() <<
                //                                     "}");

                CD[gcur].insert(p);
                CD[gncur].insert(p);
                revCD[p].insert(gcur);
                revCD[p].insert(gncur);

                ncur = ncur->getSingleSuccessor();
            } while (!(CAp.isBlue(ncur) || CAp.isRed(ncur)));
            assert(ncur == b3);
            (void) b3;

            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;
    }